

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  int iVar1;
  Type TVar2;
  TestPartResult *pTVar3;
  AssertionResult *pAVar4;
  char *pcVar5;
  AssertionResult *this;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  undefined8 in_RDI;
  Type in_R9D;
  AssertionResult AVar6;
  TestPartResult *r;
  int i;
  Message msg;
  string expected;
  TestPartResult *in_stack_fffffffffffffe68;
  Message *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  TestPartResultArray *in_stack_fffffffffffffe80;
  TestPartResult *in_stack_fffffffffffffe98;
  AssertionResult *in_stack_fffffffffffffea0;
  AssertionResult *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  int local_78;
  allocator<char> local_51;
  string local_50 [36];
  Type local_2c;
  
  local_2c = in_R9D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,&in_stack_fffffffffffffea8->success_,
             (allocator<char> *)in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator(&local_51);
  Message::Message((Message *)in_stack_fffffffffffffea0);
  iVar1 = TestPartResultArray::size((TestPartResultArray *)0x1b9d03);
  if (iVar1 == 1) {
    pTVar3 = TestPartResultArray::GetTestPartResult
                       (in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    TVar2 = TestPartResult::type(pTVar3);
    if (TVar2 == local_2c) {
      pAVar4 = (AssertionResult *)TestPartResult::message((TestPartResult *)0x1ba077);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar5 = strstr(&pAVar4->success_,pcVar5);
      if (pcVar5 == (char *)0x0) {
        AssertionFailure();
        this = AssertionResult::operator<<
                         (in_stack_fffffffffffffea0,(char (*) [11])in_stack_fffffffffffffe98);
        pTVar3 = (TestPartResult *)
                 AssertionResult::operator<<
                           (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffe98);
        AssertionResult::operator<<(this,(char (*) [14])pTVar3);
        AssertionResult::operator<<
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar3)
        ;
        AssertionResult::operator<<(this,(char (*) [3])pTVar3);
        AssertionResult::operator<<(this,(char (*) [11])pTVar3);
        AssertionResult::operator<<(this,pTVar3);
        AssertionResult::AssertionResult((AssertionResult *)in_stack_fffffffffffffeb0,pAVar4);
        AssertionResult::~AssertionResult((AssertionResult *)0x1ba17e);
      }
      else {
        AssertionSuccess();
      }
    }
    else {
      AssertionFailure();
      AssertionResult::operator<<
                (in_stack_fffffffffffffea0,(char (*) [11])in_stack_fffffffffffffe98);
      AssertionResult::operator<<
                (in_stack_fffffffffffffea0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe98);
      AssertionResult::operator<<(in_stack_fffffffffffffea0,(char (*) [2])in_stack_fffffffffffffe98)
      ;
      AssertionResult::operator<<
                (in_stack_fffffffffffffea0,(char (*) [11])in_stack_fffffffffffffe98);
      pAVar4 = AssertionResult::operator<<(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      AssertionResult::AssertionResult(pAVar4,in_stack_fffffffffffffea8);
      AssertionResult::~AssertionResult((AssertionResult *)0x1ba034);
    }
  }
  else {
    Message::operator<<(in_stack_fffffffffffffe70,(char (*) [11])in_stack_fffffffffffffe68);
    Message::operator<<(in_stack_fffffffffffffe70,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffe68);
    Message::operator<<(in_stack_fffffffffffffe70,(char (*) [2])in_stack_fffffffffffffe68);
    Message::operator<<(in_stack_fffffffffffffe70,(char (*) [11])in_stack_fffffffffffffe68);
    TestPartResultArray::size((TestPartResultArray *)0x1b9d92);
    Message::operator<<(in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68);
    Message::operator<<(in_stack_fffffffffffffe70,(char (*) [10])in_stack_fffffffffffffe68);
    for (local_78 = 0; iVar1 = TestPartResultArray::size((TestPartResultArray *)0x1b9df4),
        local_78 < iVar1; local_78 = local_78 + 1) {
      Message::operator<<(in_stack_fffffffffffffe70,(char (*) [2])in_stack_fffffffffffffe68);
      TestPartResultArray::GetTestPartResult
                (in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      Message::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    AssertionFailure();
    AssertionResult::operator<<(in_stack_fffffffffffffea0,(Message *)in_stack_fffffffffffffe98);
    AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    AssertionResult::~AssertionResult((AssertionResult *)0x1b9f14);
  }
  Message::~Message((Message *)0x1ba1d5);
  std::__cxx11::string::~string(local_50);
  AVar6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar6._0_8_ = in_RDI;
  return AVar6;
}

Assistant:

static AssertionResult HasOneFailure(const char* /* results_expr */,
                                     const char* /* type_expr */,
                                     const char* /* substr_expr */,
                                     const TestPartResultArray& results,
                                     TestPartResult::Type type,
                                     const std::string& substr) {
  const std::string expected(type == TestPartResult::kFatalFailure
                                 ? "1 fatal failure"
                                 : "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == nullptr) {
    return AssertionFailure()
           << "Expected: " << expected << " containing \"" << substr << "\"\n"
           << "  Actual:\n"
           << r;
  }

  return AssertionSuccess();
}